

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.cpp
# Opt level: O1

optional<fs::path> *
node::FindSnapshotChainstateDir(optional<fs::path> *__return_storage_ptr__,path *data_dir)

{
  char cVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  long in_FS_OFFSET;
  path possible_dir;
  string local_108;
  path local_e8;
  path local_c0;
  path local_98;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_70;
  path local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&local_c0,&data_dir->super_path);
  tinyformat::format<std::basic_string_view<char,std::char_traits<char>>>
            (&local_108,(tinyformat *)"chainstate%s",SNAPSHOT_CHAINSTATE_SUFFIX,in_RCX);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&local_70,local_108._M_dataplus._M_p,
             local_108._M_dataplus._M_p + local_108._M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            (&local_50,&local_70,auto_format);
  std::filesystem::__cxx11::path::path(&local_e8,&local_50);
  std::filesystem::__cxx11::path::~path(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::operator/=(&local_c0,(path *)&local_e8);
  std::filesystem::__cxx11::path::path(&local_98,&local_c0);
  std::filesystem::__cxx11::path::~path(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_c0);
  cVar1 = std::filesystem::status((path *)&local_98);
  bVar2 = false;
  if ((cVar1 != '\0') && (cVar1 != -1)) {
    std::filesystem::__cxx11::path::path((path *)__return_storage_ptr__,&local_98);
    bVar2 = true;
  }
  (__return_storage_ptr__->super__Optional_base<fs::path,_false,_false>)._M_payload.
  super__Optional_payload<fs::path,_true,_false,_false>.super__Optional_payload_base<fs::path>.
  _M_engaged = bVar2;
  std::filesystem::__cxx11::path::~path(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<fs::path> FindSnapshotChainstateDir(const fs::path& data_dir)
{
    fs::path possible_dir =
        data_dir / fs::u8path(strprintf("chainstate%s", SNAPSHOT_CHAINSTATE_SUFFIX));

    if (fs::exists(possible_dir)) {
        return possible_dir;
    }
    return std::nullopt;
}